

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall cmTarget::IsAppBundleOnApple(cmTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  bool local_74;
  allocator local_71;
  string local_70;
  byte local_4d;
  byte local_3a;
  allocator local_39;
  string local_38;
  cmTarget *local_18;
  cmTarget *this_local;
  
  local_18 = this;
  TVar4 = GetType(this);
  local_3a = 0;
  local_4d = 0;
  bVar2 = false;
  bVar1 = false;
  local_74 = false;
  if (TVar4 == EXECUTABLE) {
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string((string *)&local_38,"APPLE",&local_39);
    local_4d = 1;
    bVar3 = cmMakefile::IsOn(this_00,&local_38);
    local_74 = false;
    if (bVar3) {
      std::allocator<char>::allocator();
      bVar2 = true;
      std::__cxx11::string::string((string *)&local_70,"MACOSX_BUNDLE",&local_71);
      bVar1 = true;
      local_74 = GetPropertyAsBool(this,&local_70);
    }
  }
  this_local._7_1_ = local_74;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  if ((local_4d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmTarget::IsAppBundleOnApple() const
{
  return (this->GetType() == cmStateEnums::EXECUTABLE &&
          this->Makefile->IsOn("APPLE") &&
          this->GetPropertyAsBool("MACOSX_BUNDLE"));
}